

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteTypeEntry(WatWriter *this,TypeEntry *type)

{
  Index index;
  bool bVar1;
  TypeEntryKind TVar2;
  FuncType *pFVar3;
  StructType *pSVar4;
  ArrayType *pAVar5;
  ArrayType *array_type;
  reference local_58;
  Field *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wabt::Field,_std::allocator<wabt::Field>_> *__range3;
  Index field_index;
  StructType *struct_type;
  TypeEntry *local_18;
  TypeEntry *type_local;
  WatWriter *this_local;
  
  local_18 = type;
  type_local = (TypeEntry *)this;
  WriteOpenSpace(this,"type");
  string_view::string_view((string_view *)&struct_type,&local_18->name);
  index = this->type_index_;
  this->type_index_ = index + 1;
  WriteNameOrIndex(this,_struct_type,index,Space);
  TVar2 = TypeEntry::kind(local_18);
  if (TVar2 == Func) {
    WriteOpenSpace(this,"func");
    pFVar3 = cast<wabt::FuncType,wabt::TypeEntry>(local_18);
    WriteFuncSigSpace(this,&pFVar3->sig);
    WriteCloseSpace(this);
  }
  else if (TVar2 == Struct) {
    pSVar4 = cast<wabt::StructType,wabt::TypeEntry>(local_18);
    WriteOpenSpace(this,"struct");
    __range3._4_4_ = 0;
    __end3 = std::vector<wabt::Field,_std::allocator<wabt::Field>_>::begin(&pSVar4->fields);
    field = (Field *)std::vector<wabt::Field,_std::allocator<wabt::Field>_>::end(&pSVar4->fields);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
                                       *)&field), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
                 ::operator*(&__end3);
      WriteOpenSpace(this,"field");
      string_view::string_view((string_view *)&array_type,&local_58->name);
      WriteNameOrIndex(this,_array_type,__range3._4_4_,Space);
      WriteField(this,local_58);
      WriteCloseSpace(this);
      __gnu_cxx::
      __normal_iterator<const_wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
      ::operator++(&__end3);
      __range3._4_4_ = __range3._4_4_ + 1;
    }
    WriteCloseSpace(this);
  }
  else if (TVar2 == Array) {
    pAVar5 = cast<wabt::ArrayType,wabt::TypeEntry>(local_18);
    WriteOpenSpace(this,"array");
    WriteField(this,&pAVar5->field);
    WriteCloseSpace(this);
  }
  WriteCloseNewline(this);
  return;
}

Assistant:

void WatWriter::WriteTypeEntry(const TypeEntry& type) {
  WriteOpenSpace("type");
  WriteNameOrIndex(type.name, type_index_++, NextChar::Space);
  switch (type.kind()) {
    case TypeEntryKind::Func:
      WriteOpenSpace("func");
      WriteFuncSigSpace(cast<FuncType>(&type)->sig);
      WriteCloseSpace();
      break;

    case TypeEntryKind::Struct: {
      auto* struct_type = cast<StructType>(&type);
      WriteOpenSpace("struct");
      Index field_index = 0;
      for (auto&& field : struct_type->fields) {
        // TODO: Write shorthand if there is no name.
        WriteOpenSpace("field");
        WriteNameOrIndex(field.name, field_index++, NextChar::Space);
        WriteField(field);
        WriteCloseSpace();
      }
      WriteCloseSpace();
      break;
    }

    case TypeEntryKind::Array: {
      auto* array_type = cast<ArrayType>(&type);
      WriteOpenSpace("array");
      WriteField(array_type->field);
      WriteCloseSpace();
      break;
    }
  }
  WriteCloseNewline();
}